

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocaleData::exponentForm
          (QString *__return_storage_ptr__,QLocaleData *this,QString *digits,int decpt,int precision
          ,PrecisionMode pm,bool mustMarkDecimal,int minExponentDigits)

{
  qsizetype i;
  ulong uVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  zeroDigit((QString *)&local_58,this);
  i = local_58.size;
  if (pm == PMSignificantDigits) {
    for (uVar1 = (ulong)(digits->d).size / (ulong)local_58.size; (long)uVar1 < (long)precision;
        uVar1 = uVar1 + 1) {
      QString::append(digits,(QString *)&local_58);
    }
  }
  else if (pm == PMDecimalDigits) {
    for (uVar1 = (ulong)(digits->d).size / (ulong)local_58.size; (long)uVar1 < (long)(precision + 1)
        ; uVar1 = uVar1 + 1) {
      QString::append(digits,(QString *)&local_58);
    }
  }
  if ((mustMarkDecimal) || ((ulong)i < (undefined1 *)(digits->d).size)) {
    decimalPoint((QString *)&local_70,this);
    QString::insert(digits,i,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  exponentSeparator((QString *)&local_70,this);
  QString::append(digits,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  longLongToString((QString *)&local_70,this,(long)(decpt + -1),minExponentDigits,10,-1,0x10);
  QString::append(digits,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&digits->d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocaleData::exponentForm(QString &&digits, int decpt, int precision,
                                  PrecisionMode pm, bool mustMarkDecimal,
                                  int minExponentDigits) const
{
    const QString zero = zeroDigit();
    const auto digitWidth = zero.size();
    Q_ASSERT(digitWidth == 1 || digitWidth == 2);
    Q_ASSERT(digits.size() % digitWidth == 0);

    switch (pm) {
    case PMDecimalDigits:
        for (qsizetype i = digits.size() / digitWidth; i < precision + 1; ++i)
            digits.append(zero);
        break;
    case PMSignificantDigits:
        for (qsizetype i = digits.size() / digitWidth; i < precision; ++i)
            digits.append(zero);
        break;
    case PMChopTrailingZeros:
        Q_ASSERT(digits.size() / digitWidth <= 1 || !digits.endsWith(zero));
        break;
    }

    if (mustMarkDecimal || digits.size() > digitWidth)
        digits.insert(digitWidth, decimalPoint());

    digits.append(exponentSeparator());
    digits.append(longLongToString(decpt - 1, minExponentDigits, 10, -1, AlwaysShowSign));

    return std::move(digits);
}